

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_param.cc
# Opt level: O0

void __thiscall Param::Param(Param *this,ID *id,Type *type)

{
  Type *pTVar1;
  ParamField *this_00;
  char *pcVar2;
  Param *param;
  undefined8 in_RDX;
  size_type in_RSI;
  Type *in_RDI;
  Type *this_01;
  string local_68 [8];
  Object *in_stack_ffffffffffffffa0;
  string local_48 [48];
  undefined8 local_18;
  size_type local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Object::Object(in_stack_ffffffffffffffa0);
  (in_RDI->super_Object).location.field_2._M_allocated_capacity = local_10;
  *(undefined8 *)((long)&(in_RDI->super_Object).location.field_2 + 8) = local_18;
  this_01 = (Type *)&in_RDI->tot_;
  std::__cxx11::string::string((string *)this_01);
  if (*(long *)((long)&(in_RDI->super_Object).location.field_2 + 8) == 0) {
    pTVar1 = Type::Clone(in_RDI);
    *(Type **)((long)&(in_RDI->super_Object).location.field_2 + 8) = pTVar1;
  }
  Type::DataTypeConstRefStr_abi_cxx11_(this_01);
  this_00 = (ParamField *)std::__cxx11::string::c_str();
  pcVar2 = ID::Name((ID *)0x1436bc);
  strfmt_abi_cxx11_((char *)local_48,"%s %s",this_00,pcVar2);
  std::__cxx11::string::operator=((string *)&in_RDI->tot_,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  param = (Param *)operator_new(0xa0);
  ParamField::ParamField(this_00,param);
  in_RDI->env_ = (Env *)param;
  return;
}

Assistant:

Param::Param(ID* id, Type* type) : id_(id), type_(type)
	{
	if ( ! type_ )
		type_ = extern_type_int->Clone();

	decl_str_ = strfmt("%s %s", type_->DataTypeConstRefStr().c_str(), id_->Name());

	param_field_ = new ParamField(this);
	}